

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O1

bool __thiscall google::protobuf::io::CodedOutputStream::HadError(CodedOutputStream *this)

{
  uint8_t *puVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  puVar1 = EpsCopyOutputStream::FlushAndResetBuffer(&this->impl_,this->cur_);
  this->cur_ = puVar1;
  if (puVar1 == (uint8_t *)0x0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.h"
               ,0x43c);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: cur_: ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return (this->impl_).had_error_;
}

Assistant:

bool HadError() {
    cur_ = impl_.FlushAndResetBuffer(cur_);
    GOOGLE_DCHECK(cur_);
    return impl_.HadError();
  }